

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O2

bool __thiscall QGridLayout::hasHeightForWidth(QGridLayout *this)

{
  QGridLayoutPrivate *this_00;
  bool bVar1;
  int hSpacing;
  int vSpacing;
  
  this_00 = *(QGridLayoutPrivate **)&(this->super_QLayout).field_0x8;
  hSpacing = horizontalSpacing(this);
  vSpacing = verticalSpacing(this);
  bVar1 = QGridLayoutPrivate::hasHeightForWidth(this_00,hSpacing,vSpacing);
  return bVar1;
}

Assistant:

bool QGridLayout::hasHeightForWidth() const
{
    return const_cast<QGridLayout*>(this)->d_func()->hasHeightForWidth(horizontalSpacing(), verticalSpacing());
}